

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-profiler_unittest.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  __pid_t _Var4;
  TestingPortal *pTVar5;
  undefined8 *puVar6;
  char *pcVar7;
  void *__ptr;
  int size;
  int extraout_EDX;
  int size_00;
  int extraout_EDX_00;
  int size_01;
  int size_02;
  int size_03;
  char *pcVar8;
  undefined8 uStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator<char> local_31;
  
  pTVar5 = tcmalloc::TestingPortal::Get();
  puVar6 = (undefined8 *)(**(code **)(*(long *)pTVar5 + 0x28))(pTVar5);
  *puVar6 = 0x80000;
  if (2 < argc) {
LAB_001025c1:
    printf("USAGE: %s [number of children to fork]\n",*argv);
    exit(0);
  }
  iVar1 = 0;
  if (argc == 2) {
    if (*argv[1] == '-') goto LAB_001025c1;
    iVar1 = atoi(argv[1]);
  }
  iVar2 = IsHeapProfilerRunning();
  if (iVar2 == 0) {
    pcVar7 = getenv("TMPDIR");
    pcVar8 = "/tmp";
    if (pcVar7 != (char *)0x0) {
      pcVar8 = pcVar7;
    }
    mkdir(pcVar8,0x1ed);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar8,&local_31);
    std::operator+(&local_58,&local_78,"/start_stop");
    HeapProfilerStart(local_58._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    iVar2 = IsHeapProfilerRunning();
    if (iVar2 != 0) {
      Allocate(0x28,100,size);
      Deallocate(0,0x28);
      HeapProfilerStop();
      iVar2 = IsHeapProfilerRunning();
      if (iVar2 != 0) {
        pcVar8 = "Check failed: !IsHeapProfilerRunning()\n";
        uStack_80 = 0x27;
        goto LAB_001025f9;
      }
      goto LAB_0010240d;
    }
  }
  else {
LAB_0010240d:
    iVar3 = IsHeapProfilerRunning();
    iVar2 = extraout_EDX;
    if (iVar3 != 0) {
LAB_001024ba:
      Allocate(0x28,100,iVar2);
      Deallocate(0,0x28);
      Allocate(0x28,100,size_01);
      Allocate(0x28,100,size_02);
      Allocate2(0x28,400,1000);
      Allocate2(400,1000,10000);
      Deallocate(0,1000);
      Allocate(100,100000,size_03);
      Deallocate(0,10);
      Deallocate(10,0x14);
      Deallocate(0x5a,100);
      Deallocate(0x14,0x5a);
      while( true ) {
        if (iVar1 < 1) {
          puts("DONE.");
          return 0;
        }
        _Var4 = fork();
        if (_Var4 == 0) break;
        if (_Var4 == -1) {
          puts("FORK failed!");
          return 1;
        }
        wait((void *)0x0);
        iVar1 = iVar1 + -1;
      }
      iVar1 = execl(*argv,*argv,0);
      return iVar1;
    }
    pcVar7 = getenv("TMPDIR");
    pcVar8 = "/tmp";
    if (pcVar7 != (char *)0x0) {
      pcVar8 = pcVar7;
    }
    mkdir(pcVar8,0x1ed);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar8,&local_31);
    std::operator+(&local_58,&local_78,"/dump");
    HeapProfilerStart(local_58._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    iVar2 = IsHeapProfilerRunning();
    if (iVar2 != 0) {
      Allocate(0x28,100,size_00);
      Deallocate(0,0x28);
      __ptr = (void *)GetHeapProfile();
      free(__ptr);
      HeapProfilerStop();
      iVar2 = extraout_EDX_00;
      goto LAB_001024ba;
    }
  }
  pcVar8 = "Check failed: IsHeapProfilerRunning()\n";
  uStack_80 = 0x26;
LAB_001025f9:
  syscall(1,2,pcVar8,uStack_80);
  abort();
}

Assistant:

int main(int argc, char** argv) {
  tcmalloc::TestingPortal::Get()->GetSampleParameter() = 512 << 10;

  if (argc > 2 || (argc == 2 && argv[1][0] == '-')) {
    printf("USAGE: %s [number of children to fork]\n", argv[0]);
    exit(0);
  }
  int num_forks = 0;
  if (argc == 2) {
    num_forks = atoi(argv[1]);
  }

  TestHeapProfilerStartStopIsRunning();
  TestDumpHeapProfiler();

  Allocate(0, 40, 100);
  Deallocate(0, 40);

  Allocate(0, 40, 100);
  Allocate(0, 40, 100);
  Allocate2(40, 400, 1000);
  Allocate2(400, 1000, 10000);
  Deallocate(0, 1000);

  Allocate(0, 100, 100000);
  Deallocate(0, 10);
  Deallocate(10, 20);
  Deallocate(90, 100);
  Deallocate(20, 90);

  while (num_forks-- > 0) {
    switch (fork()) {
      case -1:
        printf("FORK failed!\n");
        return 1;
      case 0:             // child
        return execl(argv[0], argv[0], nullptr);   // run child with no args
      default:
        wait(nullptr);       // we'll let the kids run one at a time
    }
  }

  printf("DONE.\n");

  return 0;
}